

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O2

BasicBlock * __thiscall
spvtools::opt::LoopPeeling::ProtectLoop
          (LoopPeeling *this,Loop *loop,Instruction *condition,BasicBlock *if_merge)

{
  IRContext *this_00;
  uint32_t cond_id;
  uint32_t true_id;
  uint32_t false_id;
  uint32_t merge_id;
  BasicBlock *parent_block;
  InstructionBuilder builder;
  
  parent_block = Loop::GetOrCreatePreHeaderBlock(loop);
  Loop::SetPreHeaderBlock(loop,(BasicBlock *)0x0);
  this_00 = this->context_;
  BasicBlock::tail((BasicBlock *)&builder);
  IRContext::KillInst(this_00,(Instruction *)builder.context_);
  InstructionBuilder::InstructionBuilder
            (&builder,this->context_,parent_block,kAnalysisInstrToBlockMapping|kAnalysisBegin);
  cond_id = Instruction::result_id(condition);
  true_id = BasicBlock::id(loop->loop_header_);
  false_id = BasicBlock::id(if_merge);
  merge_id = BasicBlock::id(if_merge);
  InstructionBuilder::AddConditionalBranch(&builder,cond_id,true_id,false_id,merge_id,0);
  return parent_block;
}

Assistant:

BasicBlock* LoopPeeling::ProtectLoop(Loop* loop, Instruction* condition,
                                     BasicBlock* if_merge) {
  // TODO(1841): Handle failure to create pre-header.
  BasicBlock* if_block = loop->GetOrCreatePreHeaderBlock();
  // Will no longer be a pre-header because of the if.
  loop->SetPreHeaderBlock(nullptr);
  // Kill the branch to the header.
  context_->KillInst(&*if_block->tail());

  InstructionBuilder builder(
      context_, if_block,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  builder.AddConditionalBranch(condition->result_id(),
                               loop->GetHeaderBlock()->id(), if_merge->id(),
                               if_merge->id());

  return if_block;
}